

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O0

UBool __thiscall icu_63::PatternMap::equals(PatternMap *this,PatternMap *other)

{
  UBool UVar1;
  PtnSkeleton *pPVar2;
  PtnSkeleton *pPVar3;
  PtnElem *local_38;
  PtnElem *myElem;
  PtnElem *otherElem;
  int32_t bootIndex;
  PatternMap *other_local;
  PatternMap *this_local;
  
  if (this != other) {
    for (otherElem._4_4_ = 0; otherElem._4_4_ < 0x34; otherElem._4_4_ = otherElem._4_4_ + 1) {
      if (this->boot[otherElem._4_4_] != other->boot[otherElem._4_4_]) {
        if ((this->boot[otherElem._4_4_] == (PtnElem *)0x0) ||
           (other->boot[otherElem._4_4_] == (PtnElem *)0x0)) {
          return '\0';
        }
        local_38 = this->boot[otherElem._4_4_];
        for (myElem = other->boot[otherElem._4_4_];
            (myElem != (PtnElem *)0x0 || local_38 != (PtnElem *)0x0 && (local_38 != myElem));
            myElem = LocalPointerBase<icu_63::PtnElem>::getAlias
                               (&(myElem->next).super_LocalPointerBase<icu_63::PtnElem>)) {
          if ((myElem == (PtnElem *)0x0) || (local_38 == (PtnElem *)0x0)) {
            return '\0';
          }
          UVar1 = icu_63::UnicodeString::operator!=(&local_38->basePattern,&myElem->basePattern);
          if ((UVar1 != '\0') ||
             (UVar1 = icu_63::UnicodeString::operator!=(&local_38->pattern,&myElem->pattern),
             UVar1 != '\0')) {
            return '\0';
          }
          pPVar2 = LocalPointerBase<icu_63::PtnSkeleton>::getAlias
                             (&(local_38->skeleton).super_LocalPointerBase<icu_63::PtnSkeleton>);
          pPVar3 = LocalPointerBase<icu_63::PtnSkeleton>::getAlias
                             (&(myElem->skeleton).super_LocalPointerBase<icu_63::PtnSkeleton>);
          if (pPVar2 != pPVar3) {
            pPVar2 = LocalPointerBase<icu_63::PtnSkeleton>::operator->
                               (&(local_38->skeleton).super_LocalPointerBase<icu_63::PtnSkeleton>);
            pPVar3 = LocalPointerBase<icu_63::PtnSkeleton>::operator*
                               (&(myElem->skeleton).super_LocalPointerBase<icu_63::PtnSkeleton>);
            UVar1 = PtnSkeleton::equals(pPVar2,pPVar3);
            if (UVar1 == '\0') {
              return '\0';
            }
          }
          local_38 = LocalPointerBase<icu_63::PtnElem>::getAlias
                               (&(local_38->next).super_LocalPointerBase<icu_63::PtnElem>);
        }
      }
    }
  }
  return '\x01';
}

Assistant:

UBool
PatternMap::equals(const PatternMap& other) const {
    if ( this==&other ) {
        return TRUE;
    }
    for (int32_t bootIndex = 0; bootIndex < MAX_PATTERN_ENTRIES; ++bootIndex) {
        if (boot[bootIndex] == other.boot[bootIndex]) {
            continue;
        }
        if ((boot[bootIndex] == nullptr) || (other.boot[bootIndex] == nullptr)) {
            return FALSE;
        }
        PtnElem *otherElem = other.boot[bootIndex];
        PtnElem *myElem = boot[bootIndex];
        while ((otherElem != nullptr) || (myElem != nullptr)) {
            if ( myElem == otherElem ) {
                break;
            }
            if ((otherElem == nullptr) || (myElem == nullptr)) {
                return FALSE;
            }
            if ( (myElem->basePattern != otherElem->basePattern) ||
                 (myElem->pattern != otherElem->pattern) ) {
                return FALSE;
            }
            if ((myElem->skeleton.getAlias() != otherElem->skeleton.getAlias()) &&
                !myElem->skeleton->equals(*(otherElem->skeleton))) {
                return FALSE;
            }
            myElem = myElem->next.getAlias();
            otherElem = otherElem->next.getAlias();
        }
    }
    return TRUE;
}